

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O2

void Saig_StrSimPrepareAig(Aig_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  uint *puVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  Vec_Ptr_t *p_00;
  
  Aig_ManReprStart(p,p->vObjs->nSize);
  p_00 = p->vObjs;
  uVar1 = p_00->nSize;
  uVar9 = (ulong)(int)uVar1;
  pvVar2 = malloc(uVar9 * 0x48);
  uVar3 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  lVar7 = uVar9 << 3;
  for (; uVar6 != uVar3; uVar3 = uVar3 + 1) {
    *(long *)((long)pvVar2 + uVar3 * 8) = (long)pvVar2 + lVar7;
    lVar7 = lVar7 + 0x40;
  }
  puVar4 = (uint *)malloc(0x10);
  puVar4[1] = uVar1;
  *puVar4 = uVar1;
  *(void **)(puVar4 + 2) = pvVar2;
  p->pData2 = puVar4;
  for (iVar8 = 0; iVar8 < (int)uVar9; iVar8 = iVar8 + 1) {
    pvVar2 = Vec_PtrEntry(p_00,iVar8);
    if (pvVar2 != (void *)0x0) {
      pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)p->pData2,iVar8);
      *(void **)((long)pvVar2 + 0x28) = pvVar5;
    }
    p_00 = p->vObjs;
    uVar9 = (ulong)(uint)p_00->nSize;
  }
  Saig_StrSimAssignOne(p->pConst1);
  for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
    pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar8);
    **(undefined4 **)((long)pvVar2 + 0x28) = 0;
  }
  return;
}

Assistant:

void Saig_StrSimPrepareAig( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManReprStart( p, Aig_ManObjNumMax(p) );
    // allocate simulation info
    p->pData2 = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p), SAIG_WORDS );
    Aig_ManForEachObj( p, pObj, i )
        pObj->pData = Vec_PtrEntry( (Vec_Ptr_t *)p->pData2, i );
    // set simulation info for constant1 and register outputs
    Saig_StrSimAssignOne( Aig_ManConst1(p) );
    Saig_ManForEachLo( p, pObj, i )
        Saig_StrSimAssignZeroInit( pObj );
}